

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::reset(SkipList *this)

{
  Node *pNVar1;
  Node *pNVar2;
  
  while (pNVar2 = this->head, pNVar2 != (Node *)0x0) {
    this->head = pNVar2->down;
    while (pNVar2 != (Node *)0x0) {
      pNVar1 = pNVar2->right;
      std::__cxx11::string::~string((string *)&pNVar2->value);
      operator_delete(pNVar2,0x38);
      pNVar2 = pNVar1;
    }
  }
  pNVar2 = (Node *)operator_new(0x38);
  pNVar2->right = (Node *)0x0;
  pNVar2->down = (Node *)0x0;
  pNVar2->key = 0;
  (pNVar2->value)._M_dataplus._M_p = (pointer)&(pNVar2->value).field_2;
  (pNVar2->value)._M_string_length = 0;
  (pNVar2->value).field_2._M_local_buf[0] = '\0';
  this->head = pNVar2;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

void SkipList::reset() {
  while (head) {
    Node *t, *p = head;
    head = head->down;
    while (p) {
      t = p->right;
      delete p;
      p = t;
    }
  }
  head = new Node();
  length = 0;
  valueSize = 0;
}